

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex<short[1]>
          (Simplex_tree<MiniSTOptions> *this,short (*simplex) [1],Filtration_value *filtration)

{
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  undefined8 extraout_RDX;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar5;
  vector<short,_std::allocator<short>_> copy;
  allocator_type local_41;
  void *local_40;
  void *local_38;
  long local_30;
  undefined8 uVar4;
  
  std::vector<short,std::allocator<short>>::vector<short_const*,void>
            ((vector<short,std::allocator<short>> *)&local_40,(short *)filtration,
             (short *)((long)filtration + 2),&local_41);
  pvVar2 = local_40;
  if (local_40 != local_38) {
    uVar3 = (long)local_38 - (long)local_40 >> 1;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_40,local_38,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar2,local_38);
  }
  pVar5 = insert_simplex_raw<std::vector<short,std::allocator<short>>>
                    (this,(vector<short,_std::allocator<short>_> *)simplex,
                     (Filtration_value *)&local_40);
  uVar4 = pVar5._8_8_;
  if (local_40 != (void *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
    uVar4 = extraout_RDX;
  }
  pVar5._8_8_ = uVar4;
  pVar5.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar5;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex(const InputVertexRange & simplex,
                                                 const Filtration_value& filtration = Filtration_value()) {
    auto first = std::begin(simplex);
    auto last = std::end(simplex);

    if (first == last)
      return std::pair<Simplex_handle, bool>(null_simplex(), true);  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return insert_simplex_raw(copy, filtration);
  }